

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O3

REF_STATUS ref_iso_signed_distance(REF_GRID_conflict ref_grid,REF_DBL *field,REF_DBL *distance)

{
  REF_CELL ref_cell;
  uint uVar1;
  REF_STATUS RVar2;
  REF_NODE pRVar3;
  undefined8 uVar4;
  long lVar5;
  REF_INT cell;
  long lVar6;
  char *pcVar7;
  REF_DBL *pRVar8;
  double dVar9;
  REF_LIST ref_list;
  REF_SEARCH ref_search;
  REF_GRID_conflict iso_grid;
  REF_DBL dist;
  REF_DBL radius;
  REF_DBL center [3];
  REF_INT cand [27];
  REF_INT nodes [27];
  REF_LIST local_170;
  REF_SEARCH local_168;
  REF_GRID local_160;
  REF_DBL *local_158;
  double local_150;
  double local_148;
  REF_DBL *local_140;
  REF_DBL local_138 [4];
  int local_118;
  int local_114;
  int local_110;
  REF_INT local_a8 [30];
  
  local_168 = (REF_SEARCH)0x0;
  uVar1 = ref_iso_insert(&local_160,ref_grid,field,0,(REF_DBL *)0x0,(REF_DBL **)0x0);
  if (uVar1 == 0) {
    lVar5 = 0x10;
    if (ref_grid->twod == 0) {
      lVar5 = 0x28;
    }
    ref_cell = *(REF_CELL *)((long)local_160->cell + lVar5 + -0x10);
    uVar1 = ref_search_create(&local_168,ref_cell->n);
    if (uVar1 == 0) {
      local_158 = distance;
      local_140 = field;
      if (0 < ref_cell->max) {
        cell = 0;
        do {
          RVar2 = ref_cell_nodes(ref_cell,cell,local_a8);
          if (RVar2 == 0) {
            if (ref_grid->twod == 0) {
              uVar1 = ref_node_bounding_sphere(local_160->node,local_a8,3,local_138,&local_148);
              if (uVar1 != 0) {
                pcVar7 = "b";
                uVar4 = 0x163;
                goto LAB_0019ca60;
              }
            }
            else {
              uVar1 = ref_node_bounding_sphere(local_160->node,local_a8,2,local_138,&local_148);
              if (uVar1 != 0) {
                pcVar7 = "b";
                uVar4 = 0x15f;
                goto LAB_0019ca60;
              }
            }
            uVar1 = ref_search_insert(local_168,cell,local_138,local_148 * 1.00000001);
            if (uVar1 != 0) {
              pcVar7 = "ins";
              uVar4 = 0x165;
              goto LAB_0019ca60;
            }
          }
          cell = cell + 1;
        } while (cell < ref_cell->max);
      }
      uVar1 = ref_list_create(&local_170);
      if (uVar1 == 0) {
        pRVar3 = ref_grid->node;
        if (0 < pRVar3->max) {
          lVar5 = 0;
          pRVar8 = local_158;
          do {
            if (-1 < pRVar3->global[lVar5]) {
              pRVar8[lVar5] = 1e+200;
              uVar1 = ref_search_nearest_candidates(local_168,local_170,pRVar3->real + lVar5 * 0xf);
              if (uVar1 != 0) {
                pcVar7 = "candidates";
                uVar4 = 0x16d;
                goto LAB_0019ca60;
              }
              if (0 < local_170->n) {
                lVar6 = 0;
                do {
                  uVar1 = ref_cell_nodes(ref_cell,local_170->value[lVar6],&local_118);
                  if (uVar1 != 0) {
                    pcVar7 = "cell";
                    uVar4 = 0x170;
                    goto LAB_0019ca60;
                  }
                  pRVar8 = local_160->node->real;
                  if (ref_grid->twod == 0) {
                    uVar1 = ref_search_distance3
                                      (pRVar8 + (long)local_118 * 0xf,pRVar8 + (long)local_114 * 0xf
                                       ,pRVar8 + (long)local_110 * 0xf,
                                       ref_grid->node->real + lVar5 * 0xf,&local_150);
                    if (uVar1 != 0) {
                      pcVar7 = "dist3";
                      uVar4 = 0x17d;
                      goto LAB_0019ca60;
                    }
                  }
                  else {
                    uVar1 = ref_search_distance2
                                      (pRVar8 + (long)local_118 * 0xf,pRVar8 + (long)local_114 * 0xf
                                       ,ref_grid->node->real + lVar5 * 0xf,&local_150);
                    if (uVar1 != 0) {
                      pcVar7 = "dist2";
                      uVar4 = 0x176;
                      goto LAB_0019ca60;
                    }
                  }
                  dVar9 = local_158[lVar5];
                  if (local_150 <= local_158[lVar5]) {
                    dVar9 = local_150;
                  }
                  local_158[lVar5] = dVar9;
                  lVar6 = lVar6 + 1;
                } while (lVar6 < local_170->n);
              }
              pRVar8 = local_158;
              if (local_140[lVar5] <= 0.0 && local_140[lVar5] != 0.0) {
                local_158[lVar5] = -local_158[lVar5];
              }
              uVar1 = ref_list_erase(local_170);
              if (uVar1 != 0) {
                pcVar7 = "reset list";
                uVar4 = 0x185;
                goto LAB_0019ca60;
              }
              pRVar3 = ref_grid->node;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < pRVar3->max);
        }
        uVar1 = ref_list_free(local_170);
        if (uVar1 == 0) {
          uVar1 = ref_search_free(local_168);
          if (uVar1 == 0) {
            uVar1 = ref_grid_free(local_160);
            if (uVar1 == 0) {
              return 0;
            }
            pcVar7 = "iso free";
            uVar4 = 0x18a;
          }
          else {
            pcVar7 = "free search";
            uVar4 = 0x188;
          }
        }
        else {
          pcVar7 = "free list";
          uVar4 = 0x187;
        }
      }
      else {
        pcVar7 = "create list";
        uVar4 = 0x167;
      }
    }
    else {
      pcVar7 = "create search";
      uVar4 = 0x15a;
    }
  }
  else {
    pcVar7 = "iso";
    uVar4 = 0x153;
  }
LAB_0019ca60:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar4,
         "ref_iso_signed_distance",(ulong)uVar1,pcVar7);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_iso_signed_distance(REF_GRID ref_grid, REF_DBL *field,
                                           REF_DBL *distance) {
  REF_GRID iso_grid;
  REF_SEARCH ref_search = NULL;
  REF_CELL ref_cell;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER], cand[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius, dist;
  REF_DBL scale = 1.0 + 1.0e-8;
  REF_LIST ref_list;
  REF_INT node, item, candidate;

  RSS(ref_iso_insert(&iso_grid, ref_grid, field, 0, NULL, NULL), "iso");

  if (ref_grid_twod(ref_grid)) {
    ref_cell = ref_grid_edg(iso_grid);
  } else {
    ref_cell = ref_grid_tri(iso_grid);
  }
  RSS(ref_search_create(&ref_search, ref_cell_n(ref_cell)), "create search");
  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    if (ref_grid_twod(ref_grid)) {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 2, center,
                                   &radius),
          "b");
    } else {
      RSS(ref_node_bounding_sphere(ref_grid_node(iso_grid), nodes, 3, center,
                                   &radius),
          "b");
    }
    RSS(ref_search_insert(ref_search, cell, center, scale * radius), "ins");
  }
  RSS(ref_list_create(&ref_list), "create list");
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    distance[node] = REF_DBL_MAX;
    RSS(ref_search_nearest_candidates(
            ref_search, ref_list,
            ref_node_xyz_ptr(ref_grid_node(ref_grid), node)),
        "candidates");
    each_ref_list_item(ref_list, item) {
      candidate = ref_list_value(ref_list, item);
      RSS(ref_cell_nodes(ref_cell, candidate, cand), "cell");
      if (ref_grid_twod(ref_grid)) {
        RSS(ref_search_distance2(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist2");
      } else {
        RSS(ref_search_distance3(
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[0]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[1]),
                ref_node_xyz_ptr(ref_grid_node(iso_grid), cand[2]),
                ref_node_xyz_ptr(ref_grid_node(ref_grid), node), &dist),
            "dist3");
      }
      distance[node] = MIN(distance[node], dist);
    }

    /* sign distanace */
    if (0.0 > field[node]) distance[node] = -distance[node];

    RSS(ref_list_erase(ref_list), "reset list");
  }
  RSS(ref_list_free(ref_list), "free list");
  RSS(ref_search_free(ref_search), "free search");

  RSS(ref_grid_free(iso_grid), "iso free");

  return REF_SUCCESS;
}